

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastF32R2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  RepeatedField<unsigned_int> *this;
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this_00;
  bool bVar4;
  unsigned_short uVar5;
  uint16_t uVar6;
  uint uVar7;
  char *pcVar8;
  uint *puVar9;
  ulong uVar10;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_198;
  unsigned_short local_18a;
  RepeatedField<unsigned_int> *pRStack_188;
  unsigned_short tag;
  RepeatedField<unsigned_int> *field;
  uint64_t local_178;
  TcParseTableBase *local_170;
  ParseContext *local_168;
  char *local_160;
  MessageLite *local_158;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_150;
  TcFieldData local_148;
  TcFieldData local_140;
  undefined1 local_131;
  uint64_t uStack_130;
  bool always_return;
  TcParseTableBase *local_128;
  ParseContext *local_120;
  char *local_118;
  MessageLite *local_110;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_108;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_100;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_f8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  
  local_178 = hasbits;
  local_170 = table;
  local_168 = ctx;
  local_160 = ptr;
  local_158 = msg;
  local_150 = data.field_0;
  uVar5 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_150);
  pMVar2 = local_158;
  pcVar8 = local_160;
  pPVar1 = local_168;
  if (uVar5 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar8 = MiniParse(pMVar2,pcVar8,pPVar1,(TcFieldData)field,local_170,local_178);
    return pcVar8;
  }
  uVar6 = TcFieldData::offset((TcFieldData *)&local_150);
  pRStack_188 = RefAt<google::protobuf::RepeatedField<unsigned_int>>(pMVar2,(ulong)uVar6);
  local_18a = UnalignedLoad<unsigned_short>(local_160);
  do {
    this = pRStack_188;
    uVar7 = UnalignedLoad<unsigned_int>(local_160 + 2);
    RepeatedField<unsigned_int>::Add(this,uVar7);
    local_160 = local_160 + 6;
    bVar4 = EpsCopyInputStream::DataAvailable(&local_168->super_EpsCopyInputStream,local_160);
    pMVar2 = local_158;
    pcVar8 = local_160;
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_198);
      if (local_170->has_bits_offset != 0) {
        uVar7 = (uint)local_178;
        puVar9 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_170->has_bits_offset);
        *puVar9 = uVar7 | *puVar9;
      }
      return pcVar8;
    }
    uVar5 = UnalignedLoad<unsigned_short>(local_160);
    local_110 = local_158;
    local_118 = local_160;
    local_120 = local_168;
  } while (uVar5 == local_18a);
  TcFieldData::TcFieldData(&data_local);
  local_108 = data_local.field_0;
  local_128 = local_170;
  uStack_130 = local_178;
  local_131 = 0;
  bVar4 = EpsCopyInputStream::DataAvailable(&local_120->super_EpsCopyInputStream,local_118);
  pMVar2 = local_110;
  pcVar8 = local_118;
  pPVar1 = local_120;
  if (!bVar4) {
    TcFieldData::TcFieldData(&local_140);
    if (local_128->has_bits_offset != 0) {
      uVar7 = (uint)uStack_130;
      puVar9 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_128->has_bits_offset);
      *puVar9 = uVar7 | *puVar9;
    }
    return pcVar8;
  }
  TcFieldData::TcFieldData(&local_148);
  this_00 = local_128;
  uVar3 = uStack_130;
  uVar5 = UnalignedLoad<unsigned_short>(pcVar8);
  uVar10 = (ulong)(int)((uint)uVar5 & (uint)this_00->fast_idx_mask);
  if ((uVar10 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this_00,uVar10 >> 3);
  local_f8.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar5;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_100.data = local_f8.data;
  pcVar8 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar8,pPVar1,(TcFieldData)local_f8,this_00,uVar3);
  return pcVar8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF32R2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedFixed<uint32_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}